

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseInfix
          (Parser *this,AST *lhs,Token *begin,uint max_precedence)

{
  uint uVar1;
  _List_node_base *p_Var2;
  Allocator *pAVar3;
  size_type sVar4;
  unsigned_long uVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  uint *puVar9;
  AST *pAVar10;
  StaticError *pSVar11;
  ostream *poVar12;
  byte bVar13;
  string *while_;
  uint max_precedence_00;
  bool is_slice;
  AST *lhs_local;
  BinaryOp bop;
  Token *local_3d0;
  allocator<char> local_3c1;
  AST *first;
  Fodder second_fodder;
  AST *obj;
  AST *pAStack_390;
  pointer local_388;
  AST *third;
  undefined4 local_364;
  AST *second;
  Fodder third_fodder;
  Token end;
  AST *rhs;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [5];
  Token op;
  
  lhs_local = lhs;
  local_3d0 = begin;
  local_364 = max_precedence;
  do {
    bop = BOP_PLUS;
    p_Var2 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    uVar1 = *(uint *)&p_Var2[1]._M_next;
    if (0x1c < uVar1) {
      return lhs_local;
    }
    max_precedence_00 = 2;
    if ((0xc5U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x10001000U >> (uVar1 & 0x1f) & 1) == 0) {
        return lhs_local;
      }
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var2 + 3),":");
      if (bVar6) {
        return lhs_local;
      }
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 3),"::");
      if (bVar6) {
        return lhs_local;
      }
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>_>
                      *)(anonymous_namespace)::binary_map_abi_cxx11_,
                     (key_type *)
                     ((this->tokens->
                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                      )._M_impl._M_node.super__List_node_base._M_next + 3));
      if (iVar8._M_node == (_Base_ptr)((anonymous_namespace)::binary_map_abi_cxx11_ + 8)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&op);
        poVar12 = std::operator<<((ostream *)
                                  &op.fodder.
                                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                  "not a binary operator: ");
        std::operator<<(poVar12,(string *)
                                ((this->tokens->
                                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 3));
        pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
        p_Var2 = (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar11,(LocationRange *)(p_Var2 + 9),(string *)&end);
        __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
      }
      bop = iVar8._M_node[2]._M_color;
      puVar9 = (uint *)std::
                       map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                       ::operator[]((map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                                     *)(anonymous_namespace)::precedence_map,&bop);
      max_precedence_00 = *puVar9;
    }
    if ((uint)local_364 <= max_precedence_00) {
      return lhs_local;
    }
    pop(&op,this);
    puVar9 = &switchD_0016641f::switchdataD_001e4600;
    switch(op.kind) {
    case BRACE_L:
      parseObjectRemainder(&end,this,&obj,&op);
      pAVar3 = this->alloc;
      span((LocationRange *)&rhs,local_3d0,&end);
      lhs_local = &Allocator::
                   make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
                             (pAVar3,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&obj)->super_AST;
      goto LAB_00166646;
    case BRACE_R:
    case BRACKET_R:
    case COMMA:
    case DOLLAR:
switchD_0016641f_caseD_1:
      poVar12 = std::operator<<((ostream *)&std::cerr,"Should not be here.");
      std::endl<char,std::char_traits<char>>(poVar12);
      abort();
    case BRACKET_L:
      first = (AST *)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      second = (AST *)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      third = (AST *)0x0;
      p_Var2 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var2[1]._M_next == 3) {
        pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
        pop(&end,this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rhs,"parsing index",(allocator<char> *)&obj);
        unexpected(pSVar11,(Parser *)&end,(Token *)&rhs,(string *)puVar9);
        __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
      }
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var2 + 3),":");
      if ((bVar6) &&
         (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 3),"::"),
         bVar6)) {
        first = parse(this,0xf);
      }
      p_Var2 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      iVar7 = *(int *)&p_Var2[1]._M_next;
      if (iVar7 == 0xc) {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var2 + 3),"::");
        if (!bVar6) {
          iVar7 = *(int *)&(this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
          goto LAB_00166882;
        }
        is_slice = true;
        pop(&end,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&second_fodder,&end.fodder);
        if (*(int *)&(this->tokens->
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_next != 3) {
          third = parse(this,0xf);
        }
LAB_0016696f:
        Token::~Token(&end);
      }
      else {
LAB_00166882:
        if (iVar7 != 3) {
          is_slice = true;
          pop(&end,this);
          bVar6 = std::operator!=(&end.data,":");
          if (bVar6) {
            pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rhs,"parsing slice",(allocator<char> *)&obj);
            unexpected(pSVar11,(Parser *)&end,(Token *)&rhs,(string *)puVar9);
            __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&second_fodder,&end.fodder);
          bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 3),":");
          while_ = (string *)this->tokens;
          if ((bVar6) && (*(int *)((while_->_M_dataplus)._M_p + 0x10) != 3)) {
            second = parse(this,0xf);
            while_ = (string *)this->tokens;
          }
          if (*(int *)((while_->_M_dataplus)._M_p + 0x10) != 3) {
            pop((Token *)&rhs,this);
            bVar6 = std::operator!=(local_258,":");
            if (bVar6) {
              pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&obj,"parsing slice",&local_3c1);
              unexpected(pSVar11,(Parser *)&rhs,(Token *)&obj,while_);
              __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&third_fodder,&local_270);
            if (*(int *)&(this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next[1]._M_next != 3) {
              third = parse(this,0xf);
            }
            Token::~Token((Token *)&rhs);
          }
          goto LAB_0016696f;
        }
        is_slice = false;
      }
      popExpect(&end,this,BRACKET_R,(char *)0x0);
      pAVar3 = this->alloc;
      span((LocationRange *)&rhs,local_3d0,&end);
      lhs_local = &Allocator::
                   make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                             (pAVar3,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&is_slice
                              ,&first,&second_fodder,&second,&third_fodder,&third,&end.fodder)->
                   super_AST;
      std::__cxx11::string::~string((string *)&rhs);
      Token::~Token(&end);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&third_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&second_fodder);
      break;
    case DOT:
      popExpect(&end,this,IDENTIFIER,(char *)0x0);
      pAVar3 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&rhs,&end);
      pAVar10 = (AST *)Allocator::makeIdentifier(pAVar3,(UString *)&rhs);
      std::__cxx11::u32string::~u32string((u32string *)&rhs);
      pAVar3 = this->alloc;
      obj = pAVar10;
      span((LocationRange *)&rhs,local_3d0,&end);
      lhs_local = &Allocator::
                   make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                             (pAVar3,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                              &end.fodder,(Identifier **)&obj)->super_AST;
LAB_00166646:
      std::__cxx11::string::~string((string *)&rhs);
      Token::~Token(&end);
      break;
    case PAREN_L:
      obj = (AST *)0x0;
      pAStack_390 = (AST *)0x0;
      local_388 = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rhs,"function argument",(allocator<char> *)&second_fodder);
      parseArgs(&end,this,(ArgParams *)&obj,(string *)&rhs,(bool *)&third_fodder);
      std::__cxx11::string::~string((string *)&rhs);
      bVar13 = 0;
      for (pAVar10 = obj; pAVar10 != pAStack_390;
          pAVar10 = (AST *)&(pAVar10->openFodder).
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
        sVar4 = (pAVar10->location).file.field_2._M_allocated_capacity;
        if ((sVar4 == 0) && (!(bool)(bVar13 ^ 1))) {
          pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
          uVar5 = (pAVar10->location).end.line;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rhs,"Positional argument after a named argument is not allowed",
                     (allocator<char> *)&second_fodder);
          StaticError::StaticError(pSVar11,(LocationRange *)(uVar5 + 8),(string *)&rhs);
          __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
        }
        bVar13 = bVar13 | sVar4 != 0;
      }
      first = (AST *)((ulong)first & 0xffffffffffffff00);
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x1f) {
        pop((Token *)&rhs,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&second_fodder,&local_270);
        first = (AST *)CONCAT71(first._1_7_,1);
        Token::~Token((Token *)&rhs);
      }
      pAVar3 = this->alloc;
      span((LocationRange *)&rhs,local_3d0,&end);
      lhs_local = &Allocator::
                   make<jsonnet::internal::Apply,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&>
                             (pAVar3,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                              (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                               *)&obj,(bool *)&third_fodder,&end.fodder,&second_fodder,
                              (bool *)&first)->super_AST;
      std::__cxx11::string::~string((string *)&rhs);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&second_fodder);
      Token::~Token(&end);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &obj);
      break;
    default:
      if (op.kind == OPERATOR) {
        rhs = parse(this,max_precedence_00);
        pAVar3 = this->alloc;
        span((LocationRange *)&end,local_3d0,rhs);
        lhs_local = &Allocator::
                     make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                               (pAVar3,(LocationRange *)&end,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&bop,
                                &rhs)->super_AST;
      }
      else {
        if (op.kind != IN) goto switchD_0016641f_caseD_1;
        if (*(int *)&(this->tokens->
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x22) {
          pop(&end,this);
          pAVar3 = this->alloc;
          span((LocationRange *)&rhs,local_3d0,&end);
          lhs_local = &Allocator::
                       make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                                 (pAVar3,(LocationRange *)&rhs,
                                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                   *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                                  &end.fodder)->super_AST;
          goto LAB_00166646;
        }
        rhs = parse(this,max_precedence_00);
        pAVar3 = this->alloc;
        span((LocationRange *)&end,local_3d0,rhs);
        lhs_local = &Allocator::
                     make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                               (pAVar3,(LocationRange *)&end,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&bop,
                                &rhs)->super_AST;
      }
      std::__cxx11::string::~string((string *)&end);
    }
    Token::~Token(&op);
  } while( true );
}

Assistant:

AST *parseInfix(AST *lhs, const Token &begin, unsigned max_precedence)
    {
        while (true) {

            BinaryOp bop = BOP_PLUS;
            unsigned op_precedence = 0;

            switch (peek().kind) {
                // Logical / arithmetic binary operator.
                case Token::IN:
                case Token::OPERATOR:
                    // These occur if the outer statement was an assert or array slice.
                    // Either way, we terminate the parsing here.
                    if (peek().data == ":" || peek().data == "::") {
                        return lhs;
                    }
                    if (!op_is_binary(peek().data, bop)) {
                        std::stringstream ss;
                        ss << "not a binary operator: " << peek().data;
                        throw StaticError(peek().location, ss.str());
                    }
                    op_precedence = precedence_map[bop];
                    break;

                // Index, Apply
                case Token::DOT:
                case Token::BRACKET_L:
                case Token::PAREN_L:
                case Token::BRACE_L:
                    op_precedence = APPLY_PRECEDENCE;
                    break;

                default:
                    // This happens when we reach EOF or the terminating token of an outer context.
                    return lhs;
            }

            // If higher precedence than the outer recursive call, let that handle it.
            if (op_precedence >= max_precedence)
                return lhs;

            Token op = pop();

            switch (op.kind) {
                case Token::BRACKET_L: {
                    bool is_slice;
                    AST *first = nullptr;
                    Fodder second_fodder;
                    AST *second = nullptr;
                    Fodder third_fodder;
                    AST *third = nullptr;

                    if (peek().kind == Token::BRACKET_R)
                        throw unexpected(pop(), "parsing index");

                    if (peek().data != ":" && peek().data != "::") {
                        first = parse(MAX_PRECEDENCE);
                    }

                    if (peek().kind == Token::OPERATOR && peek().data == "::") {
                        // Handle ::
                        is_slice = true;
                        Token joined = pop();
                        second_fodder = joined.fodder;

                        if (peek().kind != Token::BRACKET_R)
                            third = parse(MAX_PRECEDENCE);

                    } else if (peek().kind != Token::BRACKET_R) {
                        is_slice = true;
                        Token delim = pop();
                        if (delim.data != ":")
                            throw unexpected(delim, "parsing slice");

                        second_fodder = delim.fodder;

                        if (peek().data != ":" && peek().kind != Token::BRACKET_R)
                            second = parse(MAX_PRECEDENCE);

                        if (peek().kind != Token::BRACKET_R) {
                            Token delim = pop();
                            if (delim.data != ":")
                                throw unexpected(delim, "parsing slice");

                            third_fodder = delim.fodder;

                            if (peek().kind != Token::BRACKET_R)
                                third = parse(MAX_PRECEDENCE);
                        }
                    } else {
                        is_slice = false;
                    }
                    Token end = popExpect(Token::BRACKET_R);
                    lhs = alloc->make<Index>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             is_slice,
                                             first,
                                             second_fodder,
                                             second,
                                             third_fodder,
                                             third,
                                             end.fodder);
                    break;
                }
                case Token::DOT: {
                    Token field_id = popExpect(Token::IDENTIFIER);
                    const Identifier *id = alloc->makeIdentifier(field_id.data32());
                    lhs = alloc->make<Index>(span(begin, field_id),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             field_id.fodder,
                                             id);
                    break;
                }
                case Token::PAREN_L: {
                    ArgParams args;
                    bool got_comma;
                    Token end = parseArgs(args, "function argument", got_comma);
                    bool got_named = false;
                    for (const auto& arg : args) {
                        if (arg.id != nullptr) {
                            got_named = true;
                        } else {
                            if (got_named) {
                                throw StaticError(arg.expr->location, "Positional argument after a named argument is not allowed");
                            }
                        }
                    }
                    bool tailstrict = false;
                    Fodder tailstrict_fodder;
                    if (peek().kind == Token::TAILSTRICT) {
                        Token tailstrict_token = pop();
                        tailstrict_fodder = tailstrict_token.fodder;
                        tailstrict = true;
                    }
                    lhs = alloc->make<Apply>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             args,
                                             got_comma,
                                             end.fodder,
                                             tailstrict_fodder,
                                             tailstrict);
                    break;
                }
                case Token::BRACE_L: {
                    AST *obj;
                    Token end = parseObjectRemainder(obj, op);
                    lhs = alloc->make<ApplyBrace>(span(begin, end), EMPTY_FODDER, lhs, obj);
                    break;
                }

                case Token::IN: {
                    if (peek().kind == Token::SUPER) {
                        Token super = pop();
                        lhs = alloc->make<InSuper>(
                            span(begin, super), EMPTY_FODDER, lhs, op.fodder, super.fodder);
                    } else {
                        AST *rhs = parse(op_precedence);
                        lhs = alloc->make<Binary>(
                            span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    }
                    break;
                }

                case Token::OPERATOR: {
                    AST *rhs = parse(op_precedence);
                    lhs = alloc->make<Binary>(
                        span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    break;
                }

                default: {
                    std::cerr << "Should not be here." << std::endl;
                    abort();
                }
            }
        }

        // (1 & ((1 + (1 * 1)) + 1)) & 1
        //
        //

/*
        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;
*/
    }